

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  int iVar1;
  xmlChar *pxVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (str == (char *)0x0) {
    return -1;
  }
  xmlCleanURI(uri);
  local_40 = (byte *)str;
  if ((byte)((*str & 0xdfU) + 0xbf) < 0x1a) {
    lVar5 = 0;
    while (((bVar3 = str[lVar5 + 1], (byte)(bVar3 - 0x30) < 10 ||
            ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar3 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0))))) {
      lVar5 = lVar5 + 1;
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->scheme != (char *)0x0) {
        (*xmlFree)(uri->scheme);
      }
      pxVar2 = xmlStrndup((xmlChar *)str,(int)lVar5 + 1);
      uri->scheme = (char *)pxVar2;
      bVar3 = str[lVar5 + 1];
    }
    if (bVar3 == 0x3a) {
      pbVar6 = (byte *)(str + lVar5 + 2);
      bVar3 = *pbVar6;
      local_50 = pbVar6;
      if (bVar3 == 0x2f) {
        if (str[lVar5 + 3] == '/') {
          local_50 = (byte *)(str + lVar5 + 4);
          iVar1 = xmlParse3986Authority(uri,(char **)&local_50);
          if (iVar1 != 0) goto LAB_00186261;
          if (uri->server == (char *)0x0) {
            uri->port = -1;
          }
          iVar1 = xmlParse3986PathAbEmpty(uri,(char **)&local_50);
        }
        else {
          iVar1 = xmlParse3986PathAbsolute(uri,(char **)&local_50);
        }
        pbVar6 = local_50;
        if (iVar1 == 0) {
LAB_00186204:
          bVar3 = *pbVar6;
          local_40 = pbVar6;
          if (bVar3 == 0x3f) {
            local_40 = pbVar6 + 1;
            iVar1 = xmlParse3986Query(uri,(char **)&local_40);
            if (iVar1 != 0) goto LAB_00186261;
            bVar3 = *local_40;
          }
          if (bVar3 == 0x23) {
            local_40 = local_40 + 1;
            iVar1 = xmlParse3986Fragment(uri,(char **)&local_40);
            if (iVar1 != 0) goto LAB_00186261;
            bVar3 = *local_40;
          }
          if (bVar3 == 0) {
            return 0;
          }
          xmlCleanURI(uri);
        }
      }
      else {
        if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
          uVar4 = bVar3 - 0x21;
          if (uVar4 < 0x3f) {
            if ((0x4000000096003fe9U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
              if ((ulong)uVar4 != 4) goto LAB_001861d4;
              if ((((byte)(str[lVar5 + 3] - 0x30U) < 10) ||
                  ((uVar4 = (byte)str[lVar5 + 3] - 0x41, uVar4 < 0x26 &&
                   ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))) &&
                 (((byte)(str[lVar5 + 4] - 0x30U) < 10 ||
                  ((uVar4 = (byte)str[lVar5 + 4] - 0x41, uVar4 < 0x26 &&
                   ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))))) goto LAB_001860af;
              goto LAB_001861dd;
            }
          }
          else {
LAB_001861d4:
            if (bVar3 != 0x7e) {
LAB_001861dd:
              if (uri != (xmlURIPtr)0x0) {
                if (uri->path != (char *)0x0) {
                  (*xmlFree)(uri->path);
                }
                uri->path = (char *)0x0;
              }
              goto LAB_00186204;
            }
          }
        }
LAB_001860af:
        local_48 = pbVar6;
        local_38 = pbVar6;
        iVar1 = xmlParse3986Segment((char **)&local_48,'\0',0);
        if (iVar1 == 0) {
          do {
            pbVar6 = local_48;
            if (*local_48 != 0x2f) {
              if (uri != (xmlURIPtr)0x0) {
                if (uri->path != (char *)0x0) {
                  (*xmlFree)(uri->path);
                }
                if (local_38 == pbVar6) {
                  pxVar2 = (xmlChar *)0x0;
                }
                else {
                  iVar1 = ((-2 - (int)str) + (int)pbVar6) - (int)lVar5;
                  if ((uri->cleanup & 2) == 0) {
                    pxVar2 = (xmlChar *)xmlURIUnescapeString((char *)local_38,iVar1,(char *)0x0);
                  }
                  else {
                    pxVar2 = xmlStrndup(local_38,iVar1);
                  }
                }
                uri->path = (char *)pxVar2;
              }
              goto LAB_00186204;
            }
            local_48 = local_48 + 1;
            iVar1 = xmlParse3986Segment((char **)&local_48,'\0',1);
          } while (iVar1 == 0);
        }
      }
    }
  }
LAB_00186261:
  xmlCleanURI(uri);
  bVar3 = *str;
  local_50 = (byte *)str;
  if (bVar3 == 0x2f) {
    if (str[1] == '/') {
      local_50 = (byte *)(str + 2);
      iVar1 = xmlParse3986Authority(uri,(char **)&local_50);
      if (iVar1 != 0) goto LAB_00186464;
      iVar1 = xmlParse3986PathAbEmpty(uri,(char **)&local_50);
    }
    else {
      iVar1 = xmlParse3986PathAbsolute(uri,(char **)&local_50);
    }
    if (iVar1 == 0) {
LAB_00186404:
      bVar3 = *local_50;
      if (bVar3 == 0x3f) {
        local_50 = local_50 + 1;
        iVar1 = xmlParse3986Query(uri,(char **)&local_50);
        if (iVar1 == 0) {
          bVar3 = *local_50;
          goto LAB_0018642e;
        }
LAB_0018644a:
        iVar1 = -1;
        goto LAB_00186464;
      }
LAB_0018642e:
      if (bVar3 == 0x23) {
        local_50 = local_50 + 1;
        iVar1 = xmlParse3986Fragment(uri,(char **)&local_50);
        if (iVar1 != 0) goto LAB_0018644a;
        bVar3 = *local_50;
      }
      if (bVar3 == 0) {
        return 0;
      }
      xmlCleanURI(uri);
    }
  }
  else {
    if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
      uVar4 = bVar3 - 0x21;
      if (uVar4 < 0x3f) {
        if ((0x4000000096003fe9U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          if ((ulong)uVar4 != 4) goto LAB_001863cc;
          if ((((byte)(str[1] - 0x30U) < 10) ||
              ((uVar4 = (byte)str[1] - 0x41, uVar4 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))) &&
             (((byte)(str[2] - 0x30U) < 10 ||
              ((uVar4 = (byte)str[2] - 0x41, uVar4 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))))) goto LAB_001862dd;
          goto LAB_001863d5;
        }
      }
      else {
LAB_001863cc:
        if (bVar3 != 0x7e) {
LAB_001863d5:
          if (uri != (xmlURIPtr)0x0) {
            if (uri->path != (char *)0x0) {
              (*xmlFree)(uri->path);
            }
            uri->path = (char *)0x0;
          }
          goto LAB_00186404;
        }
      }
    }
LAB_001862dd:
    local_48 = (byte *)str;
    iVar1 = xmlParse3986Segment((char **)&local_48,':',0);
    if (iVar1 == 0) {
      do {
        pbVar6 = local_48;
        if (*local_48 != 0x2f) {
          if (uri != (xmlURIPtr)0x0) {
            if (uri->path != (char *)0x0) {
              (*xmlFree)(uri->path);
            }
            if (pbVar6 == (byte *)str) {
              pxVar2 = (xmlChar *)0x0;
            }
            else {
              iVar1 = (int)pbVar6 - (int)str;
              if ((uri->cleanup & 2) == 0) {
                pxVar2 = (xmlChar *)xmlURIUnescapeString(str,iVar1,(char *)0x0);
              }
              else {
                pxVar2 = xmlStrndup((xmlChar *)str,iVar1);
              }
            }
            uri->path = (char *)pxVar2;
          }
          local_50 = pbVar6;
          goto LAB_00186404;
        }
        local_48 = local_48 + 1;
        iVar1 = xmlParse3986Segment((char **)&local_48,'\0',1);
      } while (iVar1 == 0);
    }
  }
  iVar1 = 1;
LAB_00186464:
  xmlCleanURI(uri);
  return iVar1;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}